

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O3

char * __thiscall
google::protobuf::internal::
MapEntryImpl<CoreML::Specification::MILSpec::Program_FunctionsEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Function,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
::_InternalParse(MapEntryImpl<CoreML::Specification::MILSpec::Program_FunctionsEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Function,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
                 *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  undefined1 auVar3 [16];
  bool bVar4;
  Function *msg;
  string *s;
  uint uVar5;
  ulong uVar6;
  undefined8 *puVar7;
  byte *pbVar8;
  Arena *arena;
  pair<const_char_*,_unsigned_int> pVar9;
  pair<const_char_*,_int> pVar10;
  byte *local_38;
  undefined1 auVar2 [12];
  
  local_38 = (byte *)ptr;
  bVar4 = EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
  if (bVar4) {
    return (char *)local_38;
  }
  do {
    bVar1 = *local_38;
    uVar6 = (ulong)bVar1;
    pbVar8 = local_38 + 1;
    if ((char)bVar1 < '\0') {
      uVar5 = ((uint)bVar1 + (uint)*pbVar8 * 0x80) - 0x80;
      uVar6 = (ulong)uVar5;
      if (-1 < (char)*pbVar8) {
        pbVar8 = local_38 + 2;
        goto LAB_00215358;
      }
      pVar9 = ReadTagFallback((char *)local_38,uVar5);
      auVar2 = pVar9._0_12_;
      local_38 = (byte *)pVar9.first;
      if (local_38 == (byte *)0x0) {
        return (char *)0x0;
      }
    }
    else {
LAB_00215358:
      auVar3._8_8_ = uVar6;
      auVar3._0_8_ = pbVar8;
      auVar2 = auVar3._0_12_;
      local_38 = pbVar8;
    }
    pbVar8 = auVar2._0_8_;
    uVar5 = auVar2._8_4_;
    if (uVar5 == 10) {
      *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 1;
      uVar6 = (this->super_MessageLite)._internal_metadata_.ptr_;
      puVar7 = (undefined8 *)(uVar6 & 0xfffffffffffffffc);
      if ((uVar6 & 1) != 0) {
        puVar7 = (undefined8 *)*puVar7;
      }
      s = ArenaStringPtr::Mutable_abi_cxx11_(&this->key_,puVar7);
      bVar1 = *local_38;
      uVar5 = (uint)bVar1;
      if ((char)bVar1 < '\0') {
        pVar10 = ReadSizeFallback((char *)local_38,(uint)bVar1);
        uVar5 = pVar10.second;
        pbVar8 = (byte *)pVar10.first;
        if (pbVar8 != (byte *)0x0) goto LAB_0021543a;
        local_38 = (byte *)0x0;
      }
      else {
        pbVar8 = local_38 + 1;
LAB_0021543a:
        local_38 = (byte *)EpsCopyInputStream::ReadString
                                     (&ctx->super_EpsCopyInputStream,(char *)pbVar8,uVar5,s);
      }
      bVar4 = WireFormatLite::VerifyUtf8String
                        ((s->_M_dataplus)._M_p,(int)s->_M_string_length,PARSE,
                         "CoreML.Specification.MILSpec.Program.FunctionsEntry.key");
      if (!bVar4) {
        return (char *)0x0;
      }
    }
    else if (uVar5 == 0x12) {
      *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 2;
      uVar6 = (this->super_MessageLite)._internal_metadata_.ptr_;
      arena = (Arena *)(uVar6 & 0xfffffffffffffffc);
      if ((uVar6 & 1) != 0) {
        arena = *(Arena **)arena;
      }
      msg = this->value_;
      if (msg == (Function *)0x0) {
        msg = Arena::CreateMaybeMessage<CoreML::Specification::MILSpec::Function>(arena);
        this->value_ = msg;
        pbVar8 = local_38;
      }
      local_38 = (byte *)ParseContext::ParseMessage(ctx,&msg->super_MessageLite,(char *)pbVar8);
    }
    else {
      if ((uVar5 == 0) || ((uVar5 & 7) == 4)) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar5 - 1;
        return (char *)pbVar8;
      }
      local_38 = (byte *)UnknownFieldParse(uVar5,(string *)0x0,(char *)pbVar8,ctx);
    }
    if (local_38 == (byte *)0x0) {
      return (char *)0x0;
    }
    bVar4 = EpsCopyInputStream::DoneWithCheck
                      (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
    if (bVar4) {
      return (char *)local_38;
    }
  } while( true );
}

Assistant:

const char* _InternalParse(const char* ptr, ParseContext* ctx) final {
    while (!ctx->Done(&ptr)) {
      uint32_t tag;
      ptr = ReadTag(ptr, &tag);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      if (tag == kKeyTag) {
        set_has_key();
        KeyMapEntryAccessorType* key = mutable_key();
        ptr = KeyTypeHandler::Read(ptr, ctx, key);
        if (!Derived::ValidateKey(key)) return nullptr;
      } else if (tag == kValueTag) {
        set_has_value();
        ValueMapEntryAccessorType* value = mutable_value();
        ptr = ValueTypeHandler::Read(ptr, ctx, value);
        if (!Derived::ValidateValue(value)) return nullptr;
      } else {
        if (tag == 0 || WireFormatLite::GetTagWireType(tag) ==
                            WireFormatLite::WIRETYPE_END_GROUP) {
          ctx->SetLastTag(tag);
          return ptr;
        }
        ptr = UnknownFieldParse(tag, static_cast<std::string*>(nullptr), ptr,
                                ctx);
      }
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
    }
    return ptr;
  }